

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

bool __thiscall DataRefs::SetDefaultCarIcaoType(DataRefs *this,string *type)

{
  logLevelTy lvl;
  int ln;
  char *szMsg;
  pointer pcVar1;
  ulong uVar2;
  
  uVar2 = type->_M_string_length - 1;
  if (uVar2 < 4) {
    std::__cxx11::string::_M_assign((string *)&this->sDefaultCarIcaoType);
    XPMPSetDefaultPlaneICAO((char *)0x0,(type->_M_dataplus)._M_p);
    if (1 < (int)dataRefs.iLogLevel) goto LAB_00132040;
    pcVar1 = (this->sDefaultCarIcaoType)._M_dataplus._M_p;
    szMsg = "Default car type is \'%s\'";
    ln = 0x99d;
    lvl = logINFO;
  }
  else {
    if (2 < (int)dataRefs.iLogLevel) goto LAB_00132040;
    pcVar1 = (type->_M_dataplus)._M_p;
    szMsg = 
    "Car default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!";
    ln = 0x9a3;
    lvl = logWARN;
  }
  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp",
         ln,"SetDefaultCarIcaoType",lvl,szMsg,pcVar1);
LAB_00132040:
  return uVar2 < 4;
}

Assistant:

bool DataRefs::SetDefaultCarIcaoType(const std::string type)
{
    if (1 <= type.length() && type.length() <= 4) {
        sDefaultCarIcaoType = type;
        XPMPSetDefaultPlaneICAO(nullptr, type.c_str());  // inform libxplanemp
        LOG_MSG(logINFO,CFG_DEFAULT_CAR_TYP_INFO,sDefaultCarIcaoType.c_str());
        return true;
    }
    
    // invalid
    LOG_MSG(logWARN,ERR_CFG_CAR_DEFAULT,type.c_str(),
            sDefaultCarIcaoType.c_str());
    return false;
}